

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Plink_copy(plink **to,plink *from)

{
  plink *ppVar1;
  plink *nextpl;
  plink *from_local;
  plink **to_local;
  
  nextpl = from;
  while (nextpl != (plink *)0x0) {
    ppVar1 = nextpl->next;
    nextpl->next = *to;
    *to = nextpl;
    nextpl = ppVar1;
  }
  return;
}

Assistant:

void Plink_copy(struct plink **to, struct plink *from)
{
  struct plink *nextpl;
  while( from ){
    nextpl = from->next;
    from->next = *to;
    *to = from;
    from = nextpl;
  }
}